

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O1

float __thiscall benchmark_9::run_kernel(benchmark_9 *this,size_t iterations)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 in_register_00000004;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar15 [64];
  
  uVar3 = rdtsc();
  uVar4 = rdtsc();
  auVar5 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  auVar14 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,
                               uVar4 & 0xffffffff00000000 |
                               CONCAT44(in_register_00000004,(int)uVar4));
  uVar3 = rdtsc();
  uVar4 = rdtsc();
  auVar17 = in_ZMM2._0_16_;
  auVar6 = vcvtusi2ss_avx512f(auVar17,uVar3 & 0xffffffff00000000 |
                                      CONCAT44(in_register_00000004,(int)uVar3));
  uVar3 = rdtsc();
  auVar7 = vcvtusi2ss_avx512f(auVar17,uVar4 & 0xffffffff00000000 |
                                      CONCAT44(in_register_00000004,(int)uVar4));
  auVar8 = vcvtusi2ss_avx512f(auVar17,uVar3 & 0xffffffff00000000 |
                                      CONCAT44(in_register_00000004,(int)uVar3));
  uVar3 = rdtsc();
  uVar12 = auVar5._0_4_;
  auVar15 = ZEXT3264(CONCAT428(uVar12,CONCAT424(uVar12,CONCAT420(uVar12,CONCAT416(uVar12,CONCAT412(
                                                  uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12)))))
                                               )));
  auVar5 = vcvtusi2ss_avx512f(auVar17,uVar3 & 0xffffffff00000000 |
                                      CONCAT44(in_register_00000004,(int)uVar3));
  uVar3 = rdtsc();
  uVar12 = auVar14._0_4_;
  auVar18 = ZEXT3264(CONCAT428(uVar12,CONCAT424(uVar12,CONCAT420(uVar12,CONCAT416(uVar12,CONCAT412(
                                                  uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12)))))
                                               )));
  uVar12 = auVar6._0_4_;
  auVar16 = ZEXT3264(CONCAT428(uVar12,CONCAT424(uVar12,CONCAT420(uVar12,CONCAT416(uVar12,CONCAT412(
                                                  uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12)))))
                                               )));
  auVar14 = vcvtusi2ss_avx512f(in_ZMM7._0_16_,
                               uVar3 & 0xffffffff00000000 |
                               CONCAT44(in_register_00000004,(int)uVar3));
  uVar3 = rdtsc();
  uVar12 = auVar7._0_4_;
  auVar19 = ZEXT3264(CONCAT428(uVar12,CONCAT424(uVar12,CONCAT420(uVar12,CONCAT416(uVar12,CONCAT412(
                                                  uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12)))))
                                               )));
  uVar12 = auVar8._0_4_;
  auVar20 = ZEXT3264(CONCAT428(uVar12,CONCAT424(uVar12,CONCAT420(uVar12,CONCAT416(uVar12,CONCAT412(
                                                  uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12)))))
                                               )));
  auVar6 = vcvtusi2ss_avx512f(in_ZMM7._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  uVar3 = rdtsc();
  uVar12 = auVar5._0_4_;
  auVar23 = ZEXT3264(CONCAT428(uVar12,CONCAT424(uVar12,CONCAT420(uVar12,CONCAT416(uVar12,CONCAT412(
                                                  uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12)))))
                                               )));
  uVar12 = auVar14._0_4_;
  auVar21 = ZEXT3264(CONCAT428(uVar12,CONCAT424(uVar12,CONCAT420(uVar12,CONCAT416(uVar12,CONCAT412(
                                                  uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12)))))
                                               )));
  uVar12 = auVar6._0_4_;
  auVar22 = ZEXT3264(CONCAT428(uVar12,CONCAT424(uVar12,CONCAT420(uVar12,CONCAT416(uVar12,CONCAT412(
                                                  uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12)))))
                                               )));
  auVar5 = vcvtusi2ss_avx512f(in_ZMM10._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  uVar12 = auVar5._0_4_;
  auVar24 = ZEXT3264(CONCAT428(uVar12,CONCAT424(uVar12,CONCAT420(uVar12,CONCAT416(uVar12,CONCAT412(
                                                  uVar12,CONCAT48(uVar12,CONCAT44(uVar12,uVar12)))))
                                               )));
  auVar1 = *(undefined1 (*) [32])(this->super_benchmark).mul0;
  auVar2 = *(undefined1 (*) [32])(this->super_benchmark).mul1;
  do {
    auVar5 = vfmadd231ps_fma(auVar15._0_32_,auVar1,auVar2);
    auVar15 = ZEXT1664(auVar5);
    auVar14 = vfmadd231ps_fma(auVar18._0_32_,auVar1,auVar2);
    auVar18 = ZEXT1664(auVar14);
    auVar6 = vfmadd231ps_fma(auVar16._0_32_,auVar1,auVar2);
    auVar16 = ZEXT1664(auVar6);
    auVar7 = vfmadd231ps_fma(auVar19._0_32_,auVar1,auVar2);
    auVar19 = ZEXT1664(auVar7);
    auVar8 = vfmadd231ps_fma(auVar20._0_32_,auVar1,auVar2);
    auVar20 = ZEXT1664(auVar8);
    auVar17 = vfmadd231ps_fma(auVar23._0_32_,auVar1,auVar2);
    auVar23 = ZEXT1664(auVar17);
    auVar9 = vfmadd231ps_fma(auVar21._0_32_,auVar1,auVar2);
    auVar21 = ZEXT1664(auVar9);
    auVar10 = vfmadd231ps_fma(auVar22._0_32_,auVar1,auVar2);
    auVar22 = ZEXT1664(auVar10);
    auVar11 = vfmadd231ps_fma(auVar24._0_32_,auVar1,auVar2);
    auVar24 = ZEXT1664(auVar11);
    iterations = iterations - 1;
  } while (iterations != 0);
  auVar13._0_4_ =
       auVar6._0_4_ + auVar9._0_4_ + auVar7._0_4_ + auVar10._0_4_ +
       auVar11._0_4_ + auVar5._0_4_ + auVar8._0_4_ + auVar14._0_4_ + auVar17._0_4_ + 0.0;
  auVar13._4_4_ =
       auVar6._4_4_ + auVar9._4_4_ + auVar7._4_4_ + auVar10._4_4_ +
       auVar11._4_4_ + auVar5._4_4_ + auVar8._4_4_ + auVar14._4_4_ + auVar17._4_4_ + 0.0;
  auVar13._8_4_ =
       auVar6._8_4_ + auVar9._8_4_ + auVar7._8_4_ + auVar10._8_4_ +
       auVar11._8_4_ + auVar5._8_4_ + auVar8._8_4_ + auVar14._8_4_ + auVar17._8_4_ + 0.0;
  auVar13._12_4_ =
       auVar6._12_4_ + auVar9._12_4_ + auVar7._12_4_ + auVar10._12_4_ +
       auVar11._12_4_ + auVar5._12_4_ + auVar8._12_4_ + auVar14._12_4_ + auVar17._12_4_ + 0.0;
  auVar5 = vshufpd_avx(auVar13,auVar13,1);
  auVar14._0_4_ = auVar13._0_4_ + auVar5._0_4_;
  auVar14._4_4_ = auVar13._4_4_ + auVar5._4_4_;
  auVar14._8_4_ = auVar13._8_4_ + auVar5._8_4_;
  auVar14._12_4_ = auVar13._12_4_ + auVar5._12_4_;
  auVar5 = vhaddps_avx(auVar14,auVar14);
  return auVar5._0_4_;
}

Assistant:

float run_kernel(size_t iterations) const override
    {
            __m256 r0 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r1 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r2 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r3 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r4 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r5 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r6 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r7 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r8 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            do{
                r0 = _mm256_fmadd_ps(mul0, mul1, r0);
                r1 = _mm256_fmadd_ps(mul0, mul1, r1);
                r2 = _mm256_fmadd_ps(mul0, mul1, r2);
                r3 = _mm256_fmadd_ps(mul0, mul1, r3);
                r4 = _mm256_fmadd_ps(mul0, mul1, r4);
                r5 = _mm256_fmadd_ps(mul0, mul1, r5);
                r6 = _mm256_fmadd_ps(mul0, mul1, r6);
                r7 = _mm256_fmadd_ps(mul0, mul1, r7);
                r8 = _mm256_fmadd_ps(mul0, mul1, r8);

            }while (--iterations);

            r0 = _mm256_add_ps(r0, r4);
            r1 = _mm256_add_ps(r1, r5);
            r2 = _mm256_add_ps(r2, r6);
            r3 = _mm256_add_ps(r3, r7);

            r0 = _mm256_add_ps(r0, r1);
            r2 = _mm256_add_ps(r2, r3);
            
            r0 = _mm256_add_ps(r0, r8);
            r0 = _mm256_add_ps(r0, r2);
            return __m256_reduce_add_ps(r0);
    }